

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall GLDrawList::SortWallIntoPlane(GLDrawList *this,SortNode *head,SortNode *sort)

{
  float fVar1;
  uint uVar2;
  GLDrawItem *pGVar3;
  GLFlat *pGVar4;
  GLWall *pGVar5;
  GLWall *pGVar6;
  SortNode *child;
  float fVar7;
  SortNode *sort2;
  float newtexv;
  GLWall *ws1;
  GLWall w;
  bool ceiling;
  GLWall *ws;
  GLFlat *fh;
  SortNode *sort_local;
  SortNode *head_local;
  GLDrawList *this_local;
  
  pGVar3 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)head->itemindex);
  pGVar4 = TArray<GLFlat,_GLFlat>::operator[](&this->flats,(long)pGVar3->index);
  pGVar3 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)sort->itemindex);
  pGVar5 = TArray<GLWall,_GLWall>::operator[](&this->walls,(long)pGVar3->index);
  w.sub._7_1_ = ViewPos.Z < (double)pGVar4->z;
  if (((pGVar5->ztop[0] < pGVar4->z || pGVar5->ztop[0] == pGVar4->z) &&
      (pGVar5->ztop[1] < pGVar4->z || pGVar5->ztop[1] == pGVar4->z)) ||
     ((pGVar4->z <= pGVar5->zbottom[0] && (pGVar4->z <= pGVar5->zbottom[1])))) {
    if (((pGVar5->zbottom[0] < pGVar4->z) && (!(bool)w.sub._7_1_)) ||
       ((pGVar4->z <= pGVar5->ztop[0] && pGVar5->ztop[0] != pGVar4->z && ((bool)w.sub._7_1_)))) {
      SortNode::AddToLeft(head,sort);
    }
    else {
      SortNode::AddToRight(head,sort);
    }
  }
  else {
    GLWall::GLWall((GLWall *)&ws1,pGVar5);
    AddWall(this,(GLWall *)&ws1);
    if ((gl.flags & 0x20) != 0) {
      pGVar5->vertcount = 0;
      uVar2 = TArray<GLWall,_GLWall>::Size(&this->walls);
      pGVar5 = TArray<GLWall,_GLWall>::operator[](&this->walls,(ulong)(uVar2 - 1));
      pGVar3 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)sort->itemindex);
      pGVar6 = TArray<GLWall,_GLWall>::operator[](&this->walls,(long)pGVar3->index);
      fVar7 = pGVar6->tcs[1].v +
              ((pGVar6->tcs[0].v - pGVar6->tcs[1].v) / (pGVar6->zbottom[0] - pGVar6->ztop[0])) *
              (pGVar4->z - pGVar6->ztop[0]);
      if ((w.sub._7_1_ & 1) == 0) {
        fVar1 = pGVar4->z;
        pGVar5->zbottom[0] = fVar1;
        pGVar6->ztop[0] = fVar1;
        pGVar5->zbottom[1] = fVar1;
        pGVar6->ztop[1] = fVar1;
        pGVar5->tcs[0].v = fVar7;
        pGVar6->tcs[1].v = fVar7;
        pGVar5->tcs[3].v = fVar7;
        pGVar6->tcs[2].v = fVar7;
      }
      else {
        fVar1 = pGVar4->z;
        pGVar6->zbottom[0] = fVar1;
        pGVar5->ztop[0] = fVar1;
        pGVar6->zbottom[1] = fVar1;
        pGVar5->ztop[1] = fVar1;
        pGVar6->tcs[3].v = fVar7;
        pGVar5->tcs[2].v = fVar7;
        pGVar6->tcs[0].v = fVar7;
        pGVar5->tcs[1].v = fVar7;
      }
    }
    child = StaticSortNodeArray::GetNew(&SortNodes);
    memset(child,0,0x30);
    uVar2 = TArray<GLDrawItem,_GLDrawItem>::Size(&this->drawitems);
    child->itemindex = uVar2 - 1;
    SortNode::AddToLeft(head,sort);
    SortNode::AddToRight(head,child);
  }
  return;
}

Assistant:

void GLDrawList::SortWallIntoPlane(SortNode * head,SortNode * sort)
{
	GLFlat * fh=&flats[drawitems[head->itemindex].index];
	GLWall * ws=&walls[drawitems[sort->itemindex].index];

	bool ceiling = fh->z > ViewPos.Z;

	if ((ws->ztop[0] > fh->z || ws->ztop[1] > fh->z) && (ws->zbottom[0] < fh->z || ws->zbottom[1] < fh->z))
	{
		// We have to split this wall!

		// WARNING: NEVER EVER push a member of an array onto the array itself.
		// Bad things will happen if the memory must be reallocated!
		GLWall w = *ws;
		AddWall(&w);
	
		// Splitting is done in the shader with clip planes, if available
		if (gl.flags & RFL_NO_CLIP_PLANES)
		{
			GLWall * ws1;
			ws->vertcount = 0;	// invalidate current vertices.
			ws1=&walls[walls.Size()-1];
			ws=&walls[drawitems[sort->itemindex].index];	// may have been reallocated!
			float newtexv = ws->tcs[GLWall::UPLFT].v + ((ws->tcs[GLWall::LOLFT].v - ws->tcs[GLWall::UPLFT].v) / (ws->zbottom[0] - ws->ztop[0])) * (fh->z - ws->ztop[0]);

			// I make the very big assumption here that translucent walls in sloped sectors
			// and 3D-floors never coexist in the same level. If that were the case this
			// code would become extremely more complicated.
			if (!ceiling)
			{
				ws->ztop[1] = ws1->zbottom[1] = ws->ztop[0] = ws1->zbottom[0] = fh->z;
				ws->tcs[GLWall::UPRGT].v = ws1->tcs[GLWall::LORGT].v = ws->tcs[GLWall::UPLFT].v = ws1->tcs[GLWall::LOLFT].v = newtexv;
			}
			else
			{
				ws1->ztop[1] = ws->zbottom[1] = ws1->ztop[0] = ws->zbottom[0] = fh->z;
				ws1->tcs[GLWall::UPLFT].v = ws->tcs[GLWall::LOLFT].v = ws1->tcs[GLWall::UPRGT].v = ws->tcs[GLWall::LORGT].v=newtexv;
			}
		}

		SortNode * sort2 = SortNodes.GetNew();
		memset(sort2, 0, sizeof(SortNode));
		sort2->itemindex = drawitems.Size() - 1;

		head->AddToLeft(sort);
		head->AddToRight(sort2);
	}
	else if ((ws->zbottom[0]<fh->z && !ceiling) || (ws->ztop[0]>fh->z && ceiling))	// completely on the left side
	{
		head->AddToLeft(sort);
	}
	else
	{
		head->AddToRight(sort);
	}

}